

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invocation_interlock_placement_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::InvocationInterlockPlacementPass::forEachNext
          (InvocationInterlockPlacementPass *this,uint32_t block_id,bool reverse_cfg,
          function<void_(unsigned_int)> *f)

{
  bool bVar1;
  CFG *pCVar2;
  BasicBlock *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  reference puVar3;
  const_iterator cStack_80;
  uint32_t pred_id;
  const_iterator __end3;
  const_iterator __begin3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range3;
  function<void_(unsigned_int)> local_48;
  BasicBlock *local_28;
  BasicBlock *block;
  function<void_(unsigned_int)> *f_local;
  bool reverse_cfg_local;
  InvocationInterlockPlacementPass *pIStack_10;
  uint32_t block_id_local;
  InvocationInterlockPlacementPass *this_local;
  
  block = (BasicBlock *)f;
  f_local._3_1_ = reverse_cfg;
  f_local._4_4_ = block_id;
  pIStack_10 = this;
  if (reverse_cfg) {
    pCVar2 = Pass::cfg(&this->super_Pass);
    this_00 = CFG::block(pCVar2,f_local._4_4_);
    local_28 = this_00;
    std::function<void_(unsigned_int)>::function((function<void_(unsigned_int)> *)&__range3,f);
    std::function<void(unsigned_int)>::
    function<spvtools::opt::InvocationInterlockPlacementPass::forEachNext(unsigned_int,bool,std::function<void(unsigned_int)>)::__0,void>
              ((function<void(unsigned_int)> *)&local_48,(anon_class_32_1_54a39806 *)&__range3);
    BasicBlock::ForEachSuccessorLabel(this_00,&local_48);
    std::function<void_(unsigned_int)>::~function(&local_48);
    forEachNext(unsigned_int,bool,std::function<void(unsigned_int)>)::$_0::~__0((__0 *)&__range3);
  }
  else {
    pCVar2 = Pass::cfg(&this->super_Pass);
    this_01 = CFG::preds(pCVar2,f_local._4_4_);
    __end3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(this_01);
    cStack_80 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(this_01);
    while (bVar1 = __gnu_cxx::operator!=(&__end3,&stack0xffffffffffffff80), bVar1) {
      puVar3 = __gnu_cxx::
               __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&__end3);
      std::function<void_(unsigned_int)>::operator()(f,*puVar3);
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::operator++(&__end3);
    }
  }
  return;
}

Assistant:

void InvocationInterlockPlacementPass::forEachNext(
    uint32_t block_id, bool reverse_cfg, std::function<void(uint32_t)> f) {
  if (reverse_cfg) {
    BasicBlock* block = cfg()->block(block_id);

    block->ForEachSuccessorLabel([f](uint32_t succ_id) { f(succ_id); });
  } else {
    for (uint32_t pred_id : cfg()->preds(block_id)) {
      f(pred_id);
    }
  }
}